

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O2

void __thiscall Saturation::SaturationAlgorithm::doUnprocessedLoop(SaturationAlgorithm *this)

{
  UnprocessedClauseContainer *this_00;
  bool bVar1;
  Clause *cl;
  
  do {
    while( true ) {
      newClausesToUnprocessed(this);
      this_00 = this->_unprocessed;
      if ((this_00->_data)._front == (this_00->_data)._back) break;
      cl = UnprocessedClauseContainer::pop(this_00);
      (*(this->super_MainLoop)._vptr_MainLoop[0xe])(this,cl);
      bVar1 = forwardSimplify(this,cl);
      if (bVar1) {
        (*(this->super_MainLoop)._vptr_MainLoop[0xb])(this,cl);
        addToPassive(this,cl);
      }
      else {
        Kernel::Clause::setStore(cl,NONE);
      }
    }
    onAllProcessed(this);
    bVar1 = clausesFlushed(this);
  } while (!bVar1);
  return;
}

Assistant:

void SaturationAlgorithm::doUnprocessedLoop()
{
  do {
    newClausesToUnprocessed();

    while (!_unprocessed->isEmpty()) {
      Clause* c = _unprocessed->pop();
      poppedFromUnprocessed(c); // tells LRS's it might make sense to update limits

      ASS(!isRefutation(c));

      if (forwardSimplify(c)) {
        onClauseRetained(c);
        addToPassive(c);
        ASS_EQ(c->store(), Clause::PASSIVE);
      }
      else {
        ASS_EQ(c->store(), Clause::UNPROCESSED);
        c->setStore(Clause::NONE);
      }

      newClausesToUnprocessed();
    }

    ASS(clausesFlushed());
    onAllProcessed(); // in particular, Splitter has now recomputed model which may have triggered deletions and additions
  } while (!clausesFlushed());
}